

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::IRenderDevice> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IRenderDevice>::operator=
          (RefCntAutoPtr<Diligent::IRenderDevice> *this,IRenderDevice *pObj)

{
  IRenderDevice *pObj_local;
  RefCntAutoPtr<Diligent::IRenderDevice> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (IRenderDevice *)0x0) {
      (*(this->m_pObject->super_IObject)._vptr_IObject[2])();
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (IRenderDevice *)0x0) {
      (*(this->m_pObject->super_IObject)._vptr_IObject[1])();
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }